

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O3

CImg<char> * __thiscall
cimg_library::CImg<char>::_load_raw
          (CImg<char> *this,FILE *file,char *filename,uint size_x,uint size_y,uint size_z,
          uint size_c,bool is_multiplexed,bool invert_endianness,ulongT offset)

{
  int iVar1;
  uint uVar2;
  FILE *__stream;
  long lVar3;
  CImg<char> *this_00;
  size_t sVar4;
  CImgArgumentException *pCVar5;
  uint uVar6;
  uint z;
  uint uVar7;
  long lVar8;
  char *pcVar9;
  char *pcVar10;
  ulong uVar11;
  size_t sVar12;
  ulong uVar13;
  uint local_ec;
  stat st_buf;
  
  if (file == (FILE *)0x0 && filename == (char *)0x0) {
    pCVar5 = (CImgArgumentException *)__cxa_allocate_exception(0x10);
    pcVar9 = "non-";
    if (this->_is_shared != false) {
      pcVar9 = "";
    }
    CImgArgumentException::CImgArgumentException
              (pCVar5,
               "[instance(%u,%u,%u,%u,%p,%sshared)] CImg<%s>::load_raw(): Specified filename is (null)."
               ,(ulong)this->_width,(ulong)this->_height,(ulong)this->_depth,(ulong)this->_spectrum,
               this->_data,pcVar9,"char");
LAB_001b7d74:
    __cxa_throw(pCVar5,&CImgArgumentException::typeinfo,CImgException::~CImgException);
  }
  if ((filename != (char *)0x0) && (*filename != '\0')) {
    iVar1 = stat(filename,(stat *)&st_buf);
    if ((iVar1 == 0) && ((st_buf.st_mode & 0xf000) == 0x4000)) {
      pCVar5 = (CImgArgumentException *)__cxa_allocate_exception(0x10);
      pcVar9 = "non-";
      if (this->_is_shared != false) {
        pcVar9 = "";
      }
      CImgArgumentException::CImgArgumentException
                (pCVar5,
                 "[instance(%u,%u,%u,%u,%p,%sshared)] CImg<%s>::load_raw(): Specified filename \'%s\' is a directory."
                 ,(ulong)this->_width,(ulong)this->_height,(ulong)this->_depth,
                 (ulong)this->_spectrum,this->_data,pcVar9,"char",filename);
      goto LAB_001b7d74;
    }
  }
  uVar13 = (ulong)size_c * (ulong)size_z * (ulong)size_y * (ulong)size_x;
  __stream = (FILE *)file;
  if (file == (FILE *)0x0) {
    __stream = cimg::fopen(filename,"rb");
  }
  uVar2 = size_c;
  local_ec = size_x;
  if (uVar13 == 0) {
    lVar3 = ftell(__stream);
    if (lVar3 < 0) {
      pCVar5 = (CImgArgumentException *)__cxa_allocate_exception(0x10);
      pcVar9 = "non-";
      if (this->_is_shared != false) {
        pcVar9 = "";
      }
      pcVar10 = "(FILE*)";
      if (filename != (char *)0x0) {
        pcVar10 = filename;
      }
      CImgArgumentException::CImgArgumentException
                (pCVar5,
                 "[instance(%u,%u,%u,%u,%p,%sshared)] CImg<%s>::load_raw(): Cannot determine size of input file \'%s\'."
                 ,(ulong)this->_width,(ulong)this->_height,(ulong)this->_depth,
                 (ulong)this->_spectrum,this->_data,pcVar9,"char",pcVar10);
      goto LAB_001b7d74;
    }
    fseek(__stream,0,2);
    uVar13 = ftell(__stream);
    fseek(__stream,lVar3,0);
    local_ec = 1;
    size_y = (uint)uVar13;
    size_z = 1;
    uVar2 = 1;
  }
  fseek(__stream,offset,0);
  st_buf.st_dev._0_1_ = 0;
  this_00 = assign(this,local_ec,size_y,size_z,uVar2);
  fill(this_00,(char *)&st_buf);
  if ((size_c != 1 && is_multiplexed) || (uVar13 == 0)) {
    if (uVar13 != 0) {
      CImg((CImg<char> *)&st_buf,1,1,1,uVar2);
      uVar6 = this->_depth;
      if (0 < (int)uVar6) {
        uVar13 = (ulong)uVar2;
        uVar7 = this->_height;
        z = 0;
        do {
          if (0 < (int)uVar7) {
            uVar6 = this->_width;
            local_ec = 0;
            do {
              if (0 < (int)uVar6) {
                uVar7 = 0;
                do {
                  lVar3 = CONCAT44(st_buf.st_uid,st_buf.st_mode);
                  if ((__stream == (FILE *)0x0) || (lVar3 == 0)) {
                    pCVar5 = (CImgArgumentException *)__cxa_allocate_exception(0x10);
                    pcVar9 = "";
                    if (1 < uVar2) {
                      pcVar9 = "s";
                    }
                    CImgArgumentException::CImgArgumentException
                              (pCVar5,
                               "cimg::fread(): Invalid reading request of %u %s%s from file %p to buffer %p."
                               ,uVar13,"char",pcVar9,__stream,lVar3);
                    __cxa_throw(pCVar5,&CImgArgumentException::typeinfo,
                                CImgException::~CImgException);
                  }
                  if (uVar2 != 0) {
                    lVar8 = 0;
                    uVar11 = uVar13;
                    do {
                      sVar12 = 0x3f00000;
                      if (uVar11 < 0x3f00000) {
                        sVar12 = uVar11;
                      }
                      sVar4 = fread((void *)(lVar3 + lVar8),1,sVar12,__stream);
                      lVar8 = lVar8 + sVar4;
                      uVar11 = uVar11 - sVar4;
                    } while ((sVar12 == sVar4) && (uVar11 != 0));
                    if (uVar11 != 0) {
                      cimg::warn("cimg::fread(): Only %lu/%lu elements could be read from file.",
                                 lVar8,uVar13);
                    }
                  }
                  set_vector_at<char>(this,(CImg<char> *)&st_buf,uVar7,local_ec,z);
                  uVar7 = uVar7 + 1;
                  uVar6 = this->_width;
                } while ((int)uVar7 < (int)uVar6);
                uVar7 = this->_height;
              }
              local_ec = local_ec + 1;
            } while ((int)local_ec < (int)uVar7);
            uVar6 = this->_depth;
          }
          z = z + 1;
        } while ((int)z < (int)uVar6);
      }
      if (((char)st_buf.st_nlink == '\0') &&
         ((void *)CONCAT44(st_buf.st_uid,st_buf.st_mode) != (void *)0x0)) {
        operator_delete__((void *)CONCAT44(st_buf.st_uid,st_buf.st_mode));
      }
    }
  }
  else {
    pcVar9 = this->_data;
    if ((__stream == (FILE *)0x0) || (pcVar9 == (char *)0x0)) {
      pCVar5 = (CImgArgumentException *)__cxa_allocate_exception(0x10);
      pcVar10 = "";
      if (1 < uVar13) {
        pcVar10 = "s";
      }
      CImgArgumentException::CImgArgumentException
                (pCVar5,
                 "cimg::fread(): Invalid reading request of %u %s%s from file %p to buffer %p.",
                 uVar13,"char",pcVar10,__stream,pcVar9);
      goto LAB_001b7d74;
    }
    lVar3 = 0;
    uVar11 = uVar13;
    do {
      sVar12 = 0x3f00000;
      if (uVar11 < 0x3f00000) {
        sVar12 = uVar11;
      }
      sVar4 = fread(pcVar9 + lVar3,1,sVar12,__stream);
      lVar3 = lVar3 + sVar4;
      uVar11 = uVar11 - sVar4;
    } while ((sVar12 == sVar4) && (uVar11 != 0));
    if (uVar11 != 0) {
      cimg::warn("cimg::fread(): Only %lu/%lu elements could be read from file.",lVar3,uVar13);
    }
  }
  if (file == (FILE *)0x0) {
    if (__stream == (FILE *)0x0) {
      cimg::warn("cimg::fclose(): Specified file is (null).");
    }
    else if ((_stdin != __stream) && (_stdout != __stream)) {
      uVar2 = fclose(__stream);
      if (uVar2 != 0) {
        cimg::warn("cimg::fclose(): Error code %d returned during file closing.",(ulong)uVar2);
      }
    }
  }
  return this;
}

Assistant:

CImg<T>& _load_raw(std::FILE *const file, const char *const filename,
		       const unsigned int size_x, const unsigned int size_y,
		       const unsigned int size_z, const unsigned int size_c,
		       const bool is_multiplexed, const bool invert_endianness,
                       const ulongT offset) {
      if (!file && !filename)
        throw CImgArgumentException(_cimg_instance
                                    "load_raw(): Specified filename is (null).",
                                    cimg_instance);
      if (cimg::is_directory(filename))
        throw CImgArgumentException(_cimg_instance
                                    "load_raw(): Specified filename '%s' is a directory.",
                                    cimg_instance,filename);

      ulongT siz = (ulongT)size_x*size_y*size_z*size_c;
      unsigned int
        _size_x = size_x,
        _size_y = size_y,
        _size_z = size_z,
        _size_c = size_c;
      std::FILE *const nfile = file?file:cimg::fopen(filename,"rb");
      if (!siz) {  // Retrieve file size
        const longT fpos = cimg::ftell(nfile);
        if (fpos<0) throw CImgArgumentException(_cimg_instance
                                                "load_raw(): Cannot determine size of input file '%s'.",
                                                cimg_instance,filename?filename:"(FILE*)");
        cimg::fseek(nfile,0,SEEK_END);
        siz = cimg::ftell(nfile)/sizeof(T);
		_size_y = (unsigned int)siz;
        _size_x = _size_z = _size_c = 1;
        cimg::fseek(nfile,fpos,SEEK_SET);
      }
      cimg::fseek(nfile,offset,SEEK_SET);
      assign(_size_x,_size_y,_size_z,_size_c,0);
      if (siz && (!is_multiplexed || size_c==1)) {
        cimg::fread(_data,siz,nfile);
        if (invert_endianness) cimg::invert_endianness(_data,siz);
      } else if (siz) {
        CImg<T> buf(1,1,1,_size_c);
        cimg_forXYZ(*this,x,y,z) {
          cimg::fread(buf._data,_size_c,nfile);
          if (invert_endianness) cimg::invert_endianness(buf._data,_size_c);
          set_vector_at(buf,x,y,z);
        }
      }
      if (!file) cimg::fclose(nfile);
      return *this;
    }